

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O2

unsigned_long compute_checksum(CVmFile *fp,unsigned_long len)

{
  size_t buflen;
  CVmCRC32 crc;
  char buf [256];
  CVmCRC32 local_140;
  char local_138 [264];
  
  local_140.acc_ = 0;
  for (; len != 0; len = len - buflen) {
    buflen = 0x100;
    if (len < 0x100) {
      buflen = len;
    }
    CVmFile::read_bytes(fp,local_138,buflen);
    CVmCRC32::scan_bytes(&local_140,local_138,buflen);
  }
  return local_140.acc_;
}

Assistant:

static unsigned long compute_checksum(CVmFile *fp, unsigned long len)
{
    CVmCRC32 crc;

    /* read the file and compute the CRC value for its contents */
    while (len != 0)
    {
        char buf[256];
        size_t cur_len;
        
        /* figure out how much we can load from the file */
        cur_len = sizeof(buf);
        if (cur_len > len)
            cur_len = (size_t)len;

        /* load the data from the file */
        fp->read_bytes(buf, cur_len);

        /* deduct the amount we read from the overall file length remaining */
        len -= cur_len;

        /* scan this block into the checksum */
        crc.scan_bytes(buf, cur_len);
    }

    /* return the computed value */
    return crc.get_crc_val();
}